

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_writer.cc
# Opt level: O1

pair<char_*,_char_*> __thiscall
tcmalloc::StringGenericWriter::RecycleBuffer
          (StringGenericWriter *this,char *buf_begin,char *buf_end,int want_at_least)

{
  ulong uVar1;
  int iVar2;
  pointer pcVar3;
  ulong uVar4;
  pair<char_*,_char_*> pVar5;
  
  iVar2 = ((int)buf_begin - (int)buf_end) + this->unused_size_;
  this->unused_size_ = iVar2;
  uVar1 = this->s_->_M_string_length;
  uVar4 = uVar1;
  if (want_at_least - iVar2 != 0 && iVar2 <= want_at_least) {
    uVar4 = (uint)(want_at_least - iVar2) + uVar1;
    if (uVar4 <= uVar1 * 2) {
      uVar4 = uVar1 * 2;
    }
    std::__cxx11::string::resize((ulong)this->s_,(char)uVar4);
    this->unused_size_ = this->unused_size_ + ((int)uVar4 - (int)uVar1);
  }
  pcVar3 = (this->s_->_M_dataplus)._M_p + uVar4;
  pVar5.first = pcVar3 + -(long)this->unused_size_;
  pVar5.second = pcVar3;
  return pVar5;
}

Assistant:

std::pair<char*, char*> StringGenericWriter::RecycleBuffer(char* buf_begin, char* buf_end, int want_at_least) {
  unused_size_ -= buf_end - buf_begin;

  int deficit = want_at_least - unused_size_;
  size_t size = s_->size();
  if (deficit > 0) {
    size_t new_size = std::max(size + deficit, size * 2);
    s_->resize(new_size);
    unused_size_ += new_size - size;
    size = new_size;
  }

  char* ptr = const_cast<char*>(s_->data() + size - unused_size_);
  return {ptr, ptr + unused_size_};
}